

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int script_status(uint script_id,uint32_t *param)

{
  void *in_RSI;
  uint32_t p [11];
  int status;
  int in_stack_00000fc8;
  int in_stack_00000fcc;
  void *in_stack_00000fd0;
  int local_48;
  undefined1 auStack_44 [4];
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_14;
  
  local_14 = pigpio_command(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
  if (0 < local_14) {
    recvMax(in_stack_00000fd0,in_stack_00000fcc,in_stack_00000fc8);
    local_14 = local_48;
    if (in_RSI != (void *)0x0) {
      memcpy(in_RSI,auStack_44,0x28);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_14;
}

Assistant:

int script_status(unsigned script_id, uint32_t *param)
{
   int status;
   uint32_t p[PI_MAX_SCRIPT_PARAMS+1]; /* space for script status */

   status = pigpio_command(gPigCommand, PI_CMD_PROCP, script_id, 0, 0);

   if (status > 0)
   {
      recvMax(p, sizeof(p), status);
      status = p[0];
      if (param) memcpy(param, p+1, sizeof(p)-4);
   }

   pthread_mutex_unlock(&command_mutex);

   return status;
}